

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O0

void __thiscall
Js::ES5Array::ExtractSnapObjectDataInto(ES5Array *this,SnapObject *objData,SlabAllocator *alloc)

{
  bool bVar1;
  SnapES5ArrayGetterSetterEntry *pSVar2;
  void **ppvVar3;
  SnapES5ArrayGetterSetterEntry *entry;
  void *descriptorValidationToken;
  IndexPropertyDescriptor *descriptor;
  uint32 descriptorIndex;
  uint32 length;
  SnapES5ArrayInfo *es5ArrayInfo;
  SnapArrayInfo<void_*> *sai;
  SlabAllocator *alloc_local;
  SnapObject *objData_local;
  ES5Array *this_local;
  
  sai = (SnapArrayInfo<void_*> *)alloc;
  alloc_local = (SlabAllocator *)objData;
  objData_local = (SnapObject *)this;
  es5ArrayInfo = (SnapES5ArrayInfo *)
                 TTD::NSSnapObjects::ExtractArrayValues<void*>(&this->super_JavascriptArray,alloc);
  _descriptorIndex =
       TTD::SlabAllocatorBase<0>::SlabAllocateStruct<TTD::NSSnapObjects::SnapES5ArrayInfo>
                 ((SlabAllocatorBase<0> *)sai);
  descriptor._4_4_ = ArrayObject::GetLength((ArrayObject *)this);
  bVar1 = IsLengthWritable(this);
  _descriptorIndex->IsLengthWritable = bVar1;
  _descriptorIndex->GetterSetterCount = 0;
  pSVar2 = TTD::SlabAllocatorBase<0>::
           SlabReserveArraySpace<TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry>
                     ((SlabAllocatorBase<0> *)sai,(ulong)(descriptor._4_4_ + 1));
  _descriptorIndex->GetterSetterEntries = pSVar2;
  descriptor._0_4_ = 0xffffffff;
  descriptorValidationToken = (void *)0x0;
  entry = (SnapES5ArrayGetterSetterEntry *)0x0;
  while ((descriptor._0_4_ =
               GetNextDescriptor(this,(uint32)descriptor,
                                 (IndexPropertyDescriptor **)&descriptorValidationToken,&entry),
         (uint32)descriptor != 0xffffffff && ((uint32)descriptor < descriptor._4_4_))) {
    if ((*descriptorValidationToken & 8) != 8) {
      pSVar2 = _descriptorIndex->GetterSetterEntries + _descriptorIndex->GetterSetterCount;
      _descriptorIndex->GetterSetterCount = _descriptorIndex->GetterSetterCount + 1;
      pSVar2->Index = (uint32)descriptor;
      pSVar2->Attributes = *descriptorValidationToken;
      pSVar2->Getter = (TTDVar)0x0;
      ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__
                          ((WriteBarrierPtr *)((long)descriptorValidationToken + 8));
      if (*ppvVar3 != (void *)0x0) {
        ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__
                            ((WriteBarrierPtr *)((long)descriptorValidationToken + 8));
        pSVar2->Getter = *ppvVar3;
      }
      pSVar2->Setter = (TTDVar)0x0;
      ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__
                          ((WriteBarrierPtr *)((long)descriptorValidationToken + 0x10));
      if (*ppvVar3 != (void *)0x0) {
        ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__
                            ((WriteBarrierPtr *)((long)descriptorValidationToken + 0x10));
        pSVar2->Setter = *ppvVar3;
      }
    }
  }
  if (_descriptorIndex->GetterSetterCount == 0) {
    TTD::SlabAllocatorBase<0>::
    SlabAbortArraySpace<TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry>
              ((SlabAllocatorBase<0> *)sai,(ulong)(descriptor._4_4_ + 1));
    _descriptorIndex->GetterSetterEntries = (SnapES5ArrayGetterSetterEntry *)0x0;
  }
  else {
    TTD::SlabAllocatorBase<0>::
    SlabCommitArraySpace<TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry>
              ((SlabAllocatorBase<0> *)sai,(ulong)_descriptorIndex->GetterSetterCount,
               (ulong)(descriptor._4_4_ + 1));
  }
  _descriptorIndex->BasicArrayData = (SnapArrayInfo<void_*> *)es5ArrayInfo;
  TTD::NSSnapObjects::
  StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapES5ArrayInfo*,(TTD::NSSnapObjects::SnapObjectType)22>
            ((SnapObject *)alloc_local,_descriptorIndex);
  return;
}

Assistant:

void ES5Array::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapArrayInfo<TTD::TTDVar>* sai = TTD::NSSnapObjects::ExtractArrayValues<TTD::TTDVar>(this, alloc);

        TTD::NSSnapObjects::SnapES5ArrayInfo* es5ArrayInfo = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapES5ArrayInfo>();

        //
        //TODO: reserving memory for entire length might be a problem if we have very large sparse arrays.
        //

        uint32 length = this->GetLength();

        es5ArrayInfo->IsLengthWritable = this->IsLengthWritable();
        es5ArrayInfo->GetterSetterCount = 0;
        es5ArrayInfo->GetterSetterEntries = alloc.SlabReserveArraySpace<TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry>(length + 1); //ensure we don't do a 0 reserve

        uint32 descriptorIndex = Js::JavascriptArray::InvalidIndex;
        IndexPropertyDescriptor* descriptor = nullptr;
        void* descriptorValidationToken = nullptr;

        do
        {
            descriptorIndex = this->GetNextDescriptor(descriptorIndex, &descriptor, &descriptorValidationToken);
            if(descriptorIndex == Js::JavascriptArray::InvalidIndex || descriptorIndex >= length)
            {
                break;
            }

            if((descriptor->Attributes & PropertyDeleted) != PropertyDeleted)
            {
                TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry* entry = es5ArrayInfo->GetterSetterEntries + es5ArrayInfo->GetterSetterCount;
                es5ArrayInfo->GetterSetterCount++;

                entry->Index = (uint32)descriptorIndex;
                entry->Attributes = descriptor->Attributes;

                entry->Getter = nullptr;
                if(descriptor->Getter != nullptr)
                {
                    entry->Getter = descriptor->Getter;
                }

                entry->Setter = nullptr;
                if(descriptor->Setter != nullptr)
                {
                    entry->Setter = descriptor->Setter;
                }
            }

        } while(true);

        if(es5ArrayInfo->GetterSetterCount != 0)
        {
            alloc.SlabCommitArraySpace<TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry>(es5ArrayInfo->GetterSetterCount, length + 1);
        }
        else
        {
            alloc.SlabAbortArraySpace<TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry>(length + 1);
            es5ArrayInfo->GetterSetterEntries = nullptr;
        }

        es5ArrayInfo->BasicArrayData = sai;

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapES5ArrayInfo*, TTD::NSSnapObjects::SnapObjectType::SnapES5ArrayObject>(objData, es5ArrayInfo);
    }